

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_> *
__thiscall cmComputeLinkDepends::Compute(cmComputeLinkDepends *this)

{
  FILE *__stream;
  bool bVar1;
  TargetType TVar2;
  reference pvVar3;
  reference dep;
  undefined8 uVar4;
  reference piVar5;
  reference __x;
  iterator __first;
  iterator __last;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar6;
  byte local_119;
  char *local_f0;
  bool uniquify;
  cmTarget *t;
  LinkEntry *e;
  undefined1 local_80 [4];
  int i;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_78;
  const_reverse_iterator le;
  undefined1 local_60 [8];
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_58;
  const_reverse_iterator li;
  set<int,_std::less<int>,_std::allocator<int>_> emmitted;
  BFSEntry qe;
  cmComputeLinkDepends *this_local;
  
  AddDirectLinkEntries(this);
  while (bVar1 = std::
                 queue<cmComputeLinkDepends::BFSEntry,_std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>_>
                 ::empty(&this->BFSQueue), ((bVar1 ^ 0xffU) & 1) != 0) {
    pvVar3 = std::
             queue<cmComputeLinkDepends::BFSEntry,_std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>_>
             ::front(&this->BFSQueue);
    emmitted._M_t._M_impl.super__Rb_tree_header._M_node_count = *(size_t *)pvVar3;
    std::
    queue<cmComputeLinkDepends::BFSEntry,_std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>_>
    ::pop(&this->BFSQueue);
    FollowLinkEntry(this,(BFSEntry *)&emmitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  while (bVar1 = std::
                 queue<cmComputeLinkDepends::SharedDepEntry,_std::deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>_>
                 ::empty(&this->SharedDepQueue), ((bVar1 ^ 0xffU) & 1) != 0) {
    dep = std::
          queue<cmComputeLinkDepends::SharedDepEntry,_std::deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>_>
          ::front(&this->SharedDepQueue);
    HandleSharedDependency(this,dep);
    std::
    queue<cmComputeLinkDepends::SharedDepEntry,_std::deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>_>
    ::pop(&this->SharedDepQueue);
  }
  InferDependencies(this);
  CleanConstraintGraph(this);
  if ((this->DebugMode & 1U) != 0) {
    fprintf(_stderr,
            "------------------------------------------------------------------------------\n");
    __stream = _stderr;
    cmTarget::GetName_abi_cxx11_(this->Target);
    uVar4 = std::__cxx11::string::c_str();
    if ((this->HasConfig & 1U) == 0) {
      local_f0 = "noconfig";
    }
    else {
      local_f0 = (char *)std::__cxx11::string::c_str();
    }
    fprintf(__stream,"Link dependency analysis for target %s, config %s\n",uVar4,local_f0);
    DisplayConstraintGraph(this);
  }
  OrderLinkEntires(this);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&li);
  std::vector<int,_std::allocator<int>_>::rbegin((vector<int,_std::allocator<int>_> *)local_60);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>::
  reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
              *)&local_58,
             (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
              *)local_60);
  std::vector<int,_std::allocator<int>_>::rend((vector<int,_std::allocator<int>_> *)local_80);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>::
  reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
              *)&local_78,
             (reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
              *)local_80);
  while (bVar1 = std::operator!=(&local_58,&local_78), bVar1) {
    piVar5 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
             ::operator*(&local_58);
    e._4_4_ = *piVar5;
    __x = std::
          vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
          ::operator[](&this->EntryList,(long)e._4_4_);
    bVar1 = false;
    if (__x->Target != (cmTarget *)0x0) {
      TVar2 = cmTarget::GetType(__x->Target);
      bVar1 = TVar2 == SHARED_LIBRARY;
    }
    local_119 = 1;
    if (bVar1) {
      pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)&li,
                         (value_type_conflict1 *)((long)&e + 4));
      local_119 = pVar6.second;
    }
    if ((local_119 & 1) != 0) {
      std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
      ::push_back(&this->FinalLinkEntries,__x);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
    ::operator++(&local_58);
  }
  __first = std::
            vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
            ::begin(&this->FinalLinkEntries);
  __last = std::
           vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ::end(&this->FinalLinkEntries);
  std::
  reverse<__gnu_cxx::__normal_iterator<cmComputeLinkDepends::LinkEntry*,std::vector<cmComputeLinkDepends::LinkEntry,std::allocator<cmComputeLinkDepends::LinkEntry>>>>
            ((__normal_iterator<cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
              )__first._M_current,
             (__normal_iterator<cmComputeLinkDepends::LinkEntry_*,_std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>_>
              )__last._M_current);
  if ((this->DebugMode & 1U) != 0) {
    DisplayFinalEntries(this);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&li);
  return &this->FinalLinkEntries;
}

Assistant:

std::vector<cmComputeLinkDepends::LinkEntry> const&
cmComputeLinkDepends::Compute()
{
  // Follow the link dependencies of the target to be linked.
  this->AddDirectLinkEntries();

  // Complete the breadth-first search of dependencies.
  while(!this->BFSQueue.empty())
    {
    // Get the next entry.
    BFSEntry qe = this->BFSQueue.front();
    this->BFSQueue.pop();

    // Follow the entry's dependencies.
    this->FollowLinkEntry(qe);
    }

  // Complete the search of shared library dependencies.
  while(!this->SharedDepQueue.empty())
    {
    // Handle the next entry.
    this->HandleSharedDependency(this->SharedDepQueue.front());
    this->SharedDepQueue.pop();
    }

  // Infer dependencies of targets for which they were not known.
  this->InferDependencies();

  // Cleanup the constraint graph.
  this->CleanConstraintGraph();

  // Display the constraint graph.
  if(this->DebugMode)
    {
    fprintf(stderr,
            "---------------------------------------"
            "---------------------------------------\n");
    fprintf(stderr, "Link dependency analysis for target %s, config %s\n",
            this->Target->GetName().c_str(),
            this->HasConfig?this->Config.c_str():"noconfig");
    this->DisplayConstraintGraph();
    }

  // Compute the final ordering.
  this->OrderLinkEntires();

  // Compute the final set of link entries.
  // Iterate in reverse order so we can keep only the last occurrence
  // of a shared library.
  std::set<int> emmitted;
  for(std::vector<int>::const_reverse_iterator
        li = this->FinalLinkOrder.rbegin(),
        le = this->FinalLinkOrder.rend();
      li != le; ++li)
    {
    int i = *li;
    LinkEntry const& e = this->EntryList[i];
    cmTarget const* t = e.Target;
    // Entries that we know the linker will re-use do not need to be repeated.
    bool uniquify = t && t->GetType() == cmTarget::SHARED_LIBRARY;
    if(!uniquify || emmitted.insert(i).second)
      {
      this->FinalLinkEntries.push_back(e);
      }
    }
  // Reverse the resulting order since we iterated in reverse.
  std::reverse(this->FinalLinkEntries.begin(), this->FinalLinkEntries.end());

  // Display the final set.
  if(this->DebugMode)
    {
    this->DisplayFinalEntries();
    }

  return this->FinalLinkEntries;
}